

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

uint32_t run_container_rank_many
                   (run_container_t *container,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint32_t *puVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint32_t *puVar9;
  uint64_t uVar10;
  long lVar11;
  
  uVar3 = *begin;
  lVar8 = 0;
  iVar6 = 0;
  puVar9 = begin;
  do {
    puVar5 = end;
    if ((puVar9 == end) || (puVar5 = puVar9, 0xffff < (*puVar9 ^ uVar3))) {
      return (uint32_t)((ulong)((long)puVar5 - (long)begin) >> 2);
    }
    uVar7 = *puVar9 & 0xffff;
    iVar4 = container->n_runs;
    for (lVar8 = (long)(int)lVar8; lVar11 = (long)iVar6, lVar8 < iVar4; lVar8 = lVar8 + 1) {
      uVar1 = container->runs[lVar8].value;
      uVar2 = container->runs[lVar8].length;
      if (uVar7 <= (uint)uVar1 + (uint)uVar2) {
        uVar10 = lVar11 + start_rank;
        if (uVar1 <= uVar7) {
          uVar10 = (ulong)(uVar7 - uVar1) + start_rank + 1 + lVar11;
        }
        *ans = uVar10;
        ans = ans + 1;
        break;
      }
      iVar6 = iVar6 + (uint)uVar2 + 1;
    }
    if (iVar4 <= (int)lVar8) {
      *ans = lVar11 + start_rank;
      ans = ans + 1;
    }
    puVar9 = puVar9 + 1;
  } while( true );
}

Assistant:

uint32_t run_container_rank_many(const run_container_t *container,
                                 uint64_t start_rank, const uint32_t *begin,
                                 const uint32_t *end, uint64_t *ans) {
    const uint16_t high = (uint16_t)((*begin) >> 16);
    const uint32_t *iter = begin;
    int sum = 0;
    int i = 0;
    for (; iter != end; iter++) {
        uint32_t x = *iter;
        uint16_t xhigh = (uint16_t)(x >> 16);
        if (xhigh != high) return iter - begin;  // stop at next container

        uint32_t x32 = x & 0xFFFF;
        while (i < container->n_runs) {
            uint32_t startpoint = container->runs[i].value;
            uint32_t length = container->runs[i].length;
            uint32_t endpoint = length + startpoint;
            if (x32 <= endpoint) {
                if (x32 < startpoint) {
                    *(ans++) = start_rank + sum;
                } else {
                    *(ans++) = start_rank + sum + (x32 - startpoint) + 1;
                }
                break;
            } else {
                sum += length + 1;
                i++;
            }
        }
        if (i >= container->n_runs) *(ans++) = start_rank + sum;
    }

    return iter - begin;
}